

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedCharException::MismatchedCharException(MismatchedCharException *this)

{
  RecognitionException *in_RDI;
  BitSet *unaff_retaddr;
  string *in_stack_ffffffffffffffa8;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  RecognitionException *pRVar1;
  uint nbits;
  
  pRVar1 = in_RDI;
  std::allocator<char>::allocator();
  nbits = (uint)((ulong)pRVar1 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  RecognitionException::RecognitionException(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  (in_RDI->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedCharException_00506ad0;
  BitSet::BitSet(unaff_retaddr,nbits);
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException()
  : RecognitionException("Mismatched char")
{}